

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

void __thiscall
FatSystem::FatSystem
          (FatSystem *this,string *filename_,unsigned_long_long globalOffset_,
          OutputFormatType outputFormat_)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  ostringstream oss;
  ostringstream local_1a8 [376];
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar2 = (filename_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + filename_->_M_string_length);
  this->globalOffset = globalOffset_;
  this->type = 0;
  (this->diskLabel)._M_dataplus._M_p = (pointer)&(this->diskLabel).field_2;
  (this->diskLabel)._M_string_length = 0;
  (this->diskLabel).field_2._M_local_buf[0] = '\0';
  (this->oemName)._M_dataplus._M_p = (pointer)&(this->oemName).field_2;
  (this->oemName)._M_string_length = 0;
  (this->oemName).field_2._M_local_buf[0] = '\0';
  (this->fsType)._M_dataplus._M_p = (pointer)&(this->fsType).field_2;
  (this->fsType)._M_string_length = 0;
  (this->fsType).field_2._M_local_buf[0] = '\0';
  this->strange = 0;
  this->rootEntries = 0;
  this->totalSize = 0xffffffffffffffff;
  this->cacheEnabled = false;
  p_Var1 = &(this->cache)._M_t._M_impl.super__Rb_tree_header;
  (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->statsComputed = false;
  this->freeClusters = 0;
  this->listDeleted = false;
  this->_outputFormat = outputFormat_;
  iVar3 = open((this->filename)._M_dataplus._M_p,0);
  this->fd = iVar3;
  this->writeMode = false;
  if (-1 < iVar3) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"! Unable to open the input file: ",0x21);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->filename)._M_dataplus._M_p,
                      (this->filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," for reading",0xc);
  uVar5 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

FatSystem::FatSystem(string filename_, unsigned long long globalOffset_, OutputFormatType outputFormat_)
    : strange(0),
      filename(filename_),
      globalOffset(globalOffset_),
      totalSize(-1),
      listDeleted(false),
      statsComputed(false),
      freeClusters(0),
      cacheEnabled(false),
      type(FAT32),
    rootEntries(0)
{
    this->_outputFormat = outputFormat_;
    fd = open(filename.c_str(), O_RDONLY|O_LARGEFILE);
    writeMode = false;

    if (fd < 0) {
        ostringstream oss;
        oss << "! Unable to open the input file: " << filename << " for reading";

        throw oss.str();
    }
}